

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,HostFunc *func,Ptr *out_trap)

{
  Store *store;
  size_type sVar1;
  size_type sVar2;
  int local_84;
  size_type local_80;
  size_type local_78;
  Ref local_70;
  allocator<char> local_61;
  string local_60;
  Ptr local_40;
  Ptr *local_28;
  Ptr *out_trap_local;
  HostFunc *func_local;
  Thread *this_local;
  
  local_28 = out_trap;
  out_trap_local = (Ptr *)func;
  func_local = (HostFunc *)this;
  sVar1 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::size
                    (&this->frames_);
  sVar2 = std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::capacity
                    (&this->frames_);
  if (sVar1 == sVar2) {
    store = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"call stack exhausted",&local_61);
    Trap::New(&local_40,store,&local_60,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=(local_28,&local_40);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    this->inst_ = (Instance *)0x0;
    this->mod_ = (Module *)0x0;
    local_70 = Object::self((Object *)out_trap_local);
    local_78 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                         (&this->values_);
    local_80 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size
                         (&this->exceptions_);
    local_84 = 0;
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,unsigned_long,int,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)this,&local_70,
               &local_78,&local_80,&local_84,&this->inst_,&this->mod_);
    this_local._4_4_ = Ok;
  }
  return this_local._4_4_;
}

Assistant:

RunResult Thread::PushCall(const HostFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = nullptr;
  mod_ = nullptr;
  frames_.emplace_back(func.self(), values_.size(), exceptions_.size(), 0,
                       inst_, mod_);
  return RunResult::Ok;
}